

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

ssize_t coda_base58_decode_alloc(char *in,size_t inlen,char **out)

{
  ulong uVar1;
  char *out_00;
  ssize_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar1 = inlen * 0x2dd;
  for (sVar3 = 0; (sVar4 = inlen, inlen != sVar3 && (sVar4 = sVar3, in[sVar3] == '1'));
      sVar3 = sVar3 + 1) {
    uVar1 = uVar1 - 0x2dd;
  }
  out_00 = (char *)malloc(sVar4 + uVar1 / 1000 + 1);
  *out = out_00;
  if (out_00 == (char *)0x0) {
    sVar2 = 1;
  }
  else {
    sVar2 = coda_base58_decode(in,inlen,out_00);
    if (sVar2 < 0) {
      free(*out);
      *out = (char *)0x0;
    }
  }
  return sVar2;
}

Assistant:

ssize_t coda_base58_decode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t b256len = inlen;

    while (b256len && in[zeroes] == '1')
    {
        zeroes++;
        b256len--;
    }

    size_t needlen = zeroes + b256len * 733 / 1000 + 1;
    *out = malloc (needlen);
    if (!*out)
        return true;

    ssize_t ret = coda_base58_decode (in, inlen, *out);
    if (ret < 0)
    {
        free (*out);
        *out = NULL;
        return ret;
    }

    return ret;
}